

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dic_adapter.c
# Opt level: O0

size_t SIMPLE_conv_string_to_letters(char *s,MAFSA_letter *l,size_t sz_l)

{
  char cVar1;
  char c;
  size_t pos;
  size_t sz_l_local;
  MAFSA_letter *l_local;
  char *s_local;
  
  pos = 0;
  s_local = s;
  do {
    if (*s_local == '\0' || sz_l <= pos) {
      return pos;
    }
    cVar1 = *s_local;
    if (cVar1 == '-') {
      l[pos] = '\x1a';
    }
    else if (cVar1 == '\'') {
      l[pos] = '\x1b';
    }
    else if (cVar1 == ' ') {
      l[pos] = '\x1c';
    }
    else if ((cVar1 < 'A') || ('Z' < cVar1)) {
      if (cVar1 < 'a') {
        return pos;
      }
      if ('z' < cVar1) {
        return pos;
      }
      l[pos] = cVar1 + 0x9f;
    }
    else {
      l[pos] = cVar1 + 0xbf;
    }
    s_local = s_local + 1;
    pos = pos + 1;
  } while( true );
}

Assistant:

size_t SIMPLE_conv_string_to_letters(const char *s, MAFSA_letter *l, size_t sz_l)
{
	size_t pos;
	for (pos = 0; *s && pos < sz_l; ++s, ++pos)
	{
		char c = *s;

		if ('-' == c)
		{
			l[pos] = SIMPLE_LETTER_DEFIS;
		}
		else if ('\'' == c)
		{
			l[pos] = SIMPLE_LETTER_APOSTROPHE;
		}
		else if (' ' == c)
		{
			l[pos] = SIMPLE_LETTER_SPACE;
		}
		else
		{
			if ('A' <= c && c <= 'Z')
			{
				l[pos] = c - 'A';
			}
			else if ('a' <= c && c <= 'z')
			{
				l[pos] = c - 'a';
			}
			else
			{
				break;
			}
		}
	}

	return pos;
}